

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufUpdateInput(xmlBufPtr buf,xmlParserInputPtr input,size_t pos)

{
  size_t pos_local;
  xmlParserInputPtr input_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (input == (xmlParserInputPtr)0x0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    input->base = buf->content;
    input->cur = input->base + pos;
    input->end = buf->content + buf->use;
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufUpdateInput(xmlBufPtr buf, xmlParserInputPtr input, size_t pos) {
    if ((buf == NULL) || (input == NULL))
        return(-1);
    CHECK_COMPAT(buf)
    input->base = buf->content;
    input->cur = input->base + pos;
    input->end = &buf->content[buf->use];
    return(0);
}